

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::setRepeatCount(CommandLineArguments *this,int ac,char **av,int *i)

{
  int iVar1;
  size_t sVar2;
  SimpleString repeatParameter;
  SimpleString SStack_38;
  
  this->repeat_ = 0;
  SimpleString::SimpleString(&SStack_38,av[*i]);
  sVar2 = SimpleString::size(&SStack_38);
  if (sVar2 < 3) {
    iVar1 = *i + 1;
    if (iVar1 < ac) {
      iVar1 = SimpleString::AtoI(av[iVar1]);
      this->repeat_ = (long)iVar1;
      if (iVar1 != 0) {
        *i = *i + 1;
      }
    }
  }
  else {
    iVar1 = SimpleString::AtoI(av[*i] + 2);
    this->repeat_ = (long)iVar1;
  }
  if (this->repeat_ == 0) {
    this->repeat_ = 2;
  }
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

void CommandLineArguments::setRepeatCount(int ac, const char *const *av, int& i)
{
    repeat_ = 0;

    SimpleString repeatParameter(av[i]);
    if (repeatParameter.size() > 2) repeat_ = (size_t) (SimpleString::AtoI(av[i] + 2));
    else if (i + 1 < ac) {
        repeat_ = (size_t) (SimpleString::AtoI(av[i + 1]));
        if (repeat_ != 0) i++;
    }

    if (0 == repeat_) repeat_ = 2;

}